

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScenePrivate::grabKeyboard(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  QGraphicsItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = item;
  bVar1 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                    ((QListSpecialMethodsBase<QGraphicsItem*> *)&this->keyboardGrabberItems,
                     &local_28);
  if (bVar1) {
    if ((this->keyboardGrabberItems).d.ptr[(this->keyboardGrabberItems).d.size + -1] == local_28) {
      local_48 = 2;
      local_34 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      local_30 = "default";
      QMessageLogger::warning
                ((char *)&local_48,"QGraphicsItem::grabKeyboard: already a keyboard grabber");
    }
    else {
      local_48 = 2;
      local_34 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      local_30 = "default";
      QMessageLogger::warning
                ((char *)&local_48,
                 "QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p");
    }
  }
  else {
    if ((this->keyboardGrabberItems).d.size != 0) {
      local_48 = 0xaaaaaaaa;
      uStack_44 = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,UngrabKeyboard);
      sendEvent(this,(this->keyboardGrabberItems).d.ptr[(this->keyboardGrabberItems).d.size + -1],
                (QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
    }
    QList<QGraphicsItem_*>::append(&this->keyboardGrabberItems,local_28);
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,GrabKeyboard);
    sendEvent(this,local_28,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabKeyboard(QGraphicsItem *item)
{
    if (keyboardGrabberItems.contains(item)) {
        if (keyboardGrabberItems.constLast() == item)
            qWarning("QGraphicsItem::grabKeyboard: already a keyboard grabber");
        else
            qWarning("QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p",
                     keyboardGrabberItems.constLast());
        return;
    }

    // Send ungrab event to the last grabber.
    if (!keyboardGrabberItems.isEmpty()) {
        // Just send ungrab event to current grabber.
        QEvent ungrabEvent(QEvent::UngrabKeyboard);
        sendEvent(keyboardGrabberItems.constLast(), &ungrabEvent);
    }

    keyboardGrabberItems << item;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabKeyboard);
    sendEvent(item, &grabEvent);
}